

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPoint>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPoint> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016b73c8;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016b7020,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016b6d20;
  pzgeom::TPZGeoPoint::TPZGeoPoint(&this->fGeo,nodeindices);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_016b1180;
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}